

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status
wal_snapshot_open(filemgr *file,fdb_txn *txn,fdb_kvs_id_t kv_id,fdb_seqnum_t seqnum,
                 _fdb_key_cmp_info *key_cmp_info,snap_handle **shandle)

{
  pthread_spinlock_t *__lock;
  wal *_wal;
  snap_handle *shandle_00;
  
  _wal = file->wal;
  __lock = &_wal->lock;
  pthread_spin_lock(__lock);
  shandle_00 = _wal_get_latest_snapshot(_wal,kv_id);
  if (((shandle_00 == (snap_handle *)0x0) ||
      ((shandle_00->wal_ndocs).super___atomic_base<unsigned_long>._M_i == 0)) ||
     (shandle_00->is_flushed == true)) {
    shandle_00 = _wal_snapshot_create(kv_id,0,0);
    if (shandle_00 == (snap_handle *)0x0) {
      pthread_spin_unlock(__lock);
      return FDB_RESULT_ALLOC_FAIL;
    }
  }
  else if ((shandle_00->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i != 0) {
    atomic_incr_uint16_t(&shandle_00->ref_cnt_kvs,memory_order_seq_cst);
    goto LAB_00114a67;
  }
  _wal_snapshot_init(shandle_00,file,txn,seqnum,key_cmp_info);
LAB_00114a67:
  pthread_spin_unlock(__lock);
  *shandle = shandle_00;
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snapshot_open(struct filemgr *file,
                             fdb_txn *txn,
                             fdb_kvs_id_t kv_id,
                             fdb_seqnum_t seqnum,
                             _fdb_key_cmp_info *key_cmp_info,
                             struct snap_handle **shandle)
{
    struct wal *_wal = file->wal;
    struct snap_handle *_shandle;

    spin_lock(&_wal->lock);
    _shandle = _wal_get_latest_snapshot(_wal, kv_id);
    if (!_shandle || // No item exist in WAL for this KV Store
        !atomic_get_uint64_t(&_shandle->wal_ndocs) || // Empty snapshot
        _shandle->is_flushed) { // Latest snapshot has read-write barrier
        // This can happen when a new snapshot is attempted and WAL was flushed
        // and no mutations after WAL flush - the snapshot exists solely for
        // existing open snapshot iterators
        _shandle = _wal_snapshot_create(kv_id, 0, 0);
        if (!_shandle) { // LCOV_EXCL_START
            spin_unlock(&_wal->lock);
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        // This snapshot is not inserted into global shared tree
        _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
        DBG("%s Persisted snapshot taken at %" _F64 " for kv id %" _F64 "\n",
            file->filename, _shandle->seqnum, kv_id);
    } else { // Take a snapshot of the latest WAL state for this KV Store
        if (_wal_snap_is_immutable(_shandle)) { // existing snapshot still open
            atomic_incr_uint16_t(&_shandle->ref_cnt_kvs); // ..just Clone it
        } else { // make this snapshot of the WAL immutable..
            _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
            DBG("%s Snapshot init %" _F64 " - %" _F64 " taken at %"
                _F64 " for kv id %" _F64 "\n",
                file->filename, _shandle->snap_stop_idx,
                _shandle->snap_tag_idx, _shandle->seqnum, kv_id);
        }
    }
    spin_unlock(&_wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}